

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printMessage(AssertionPrinter *this)

{
  size_type sVar1;
  pointer pMVar2;
  ostream *poVar3;
  pointer pMVar4;
  TextAttributes local_a8;
  Text local_88;
  
  sVar1 = (this->messageLabel)._M_string_length;
  if (sVar1 != 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->stream,(this->messageLabel)._M_dataplus._M_p,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  pMVar4 = (this->messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar2 = (this->messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar4 != pMVar2) {
    do {
      poVar3 = this->stream;
      local_a8.initialIndent = 0xffffffffffffffff;
      local_a8.width = 0x4f;
      local_a8.tabChar = '\t';
      local_a8.indent = 2;
      Text::Text(&local_88,&pMVar4->message,&local_a8);
      operator<<(poVar3,&local_88);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88.lines);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
        operator_delete(local_88.str._M_dataplus._M_p);
      }
      pMVar4 = pMVar4 + 1;
    } while (pMVar4 != pMVar2);
  }
  return;
}

Assistant:

void printMessage() const {
                if( !messageLabel.empty() )
                    stream << messageLabel << ":" << "\n";
                for( std::vector<MessageInfo>::const_iterator it = messages.begin(), itEnd = messages.end();
                        it != itEnd;
                        ++it ) {
                    stream << Text( it->message, TextAttributes().setIndent(2) ) << "\n";
                }
            }